

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall duckdb_re2::RE2::CapturingGroupNames_abi_cxx11_(RE2 *this)

{
  long *plVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 *in_FS_OFFSET;
  undefined1 local_39;
  RE2 *local_38;
  undefined1 *local_30;
  RE2 **local_28;
  
  local_28 = &local_38;
  local_30 = &local_39;
  plVar1 = (long *)*in_FS_OFFSET;
  *plVar1 = (long)&local_30;
  puVar2 = (undefined8 *)*in_FS_OFFSET;
  *puVar2 = std::once_flag::_Prepare_execution::
            _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
            ::anon_class_1_0_00000001::__invoke;
  local_38 = this;
  iVar3 = pthread_once(&(this->group_names_once_)._M_once,__once_proxy);
  if (iVar3 == 0) {
    *plVar1 = 0;
    *puVar2 = 0;
    return this->group_names_;
  }
  uVar4 = std::__throw_system_error(iVar3);
  *plVar1 = 0;
  *puVar2 = 0;
  _Unwind_Resume(uVar4);
}

Assistant:

const std::map<int, std::string>& RE2::CapturingGroupNames() const {
  std::call_once(group_names_once_, [](const RE2* re) {
    if (re->suffix_regexp_ != NULL)
      re->group_names_ = re->suffix_regexp_->CaptureNames();
    if (re->group_names_ == NULL)
      re->group_names_ = empty_group_names();
  }, this);
  return *group_names_;
}